

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausSimInfoRecord(Clu_Man_t *p,int *pModel)

{
  uint *puVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = p->nCexes;
  iVar4 = p->nCexesAlloc;
  if (iVar2 == iVar4) {
    Fra_ClausSimInfoRealloc(p);
    iVar2 = p->nCexes;
    iVar4 = p->nCexesAlloc;
  }
  if (iVar2 < iVar4) {
    lVar5 = 0;
    do {
      if (p->pCnf->nVars <= lVar5) {
        p->nCexes = p->nCexes + 1;
        return;
      }
      if (pModel[lVar5] == 1) {
        pvVar3 = Vec_PtrEntry(p->vCexes,(int)lVar5);
        if ((*(uint *)((long)pvVar3 + (long)(p->nCexes >> 5) * 4) >> (p->nCexes & 0x1fU) & 1) != 0)
        {
          __assert_fail("Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                        ,0x40e,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
        }
        pvVar3 = Vec_PtrEntry(p->vCexes,(int)lVar5);
        puVar1 = (uint *)((long)pvVar3 + (long)(p->nCexes >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)p->nCexes & 0x1f);
      }
      lVar5 = lVar5 + 1;
    } while( true );
  }
  __assert_fail("p->nCexes < p->nCexesAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                ,0x409,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
}

Assistant:

void Fra_ClausSimInfoRecord( Clu_Man_t * p, int * pModel )
{
    int i;
    if ( p->nCexes == p->nCexesAlloc )
        Fra_ClausSimInfoRealloc( p );
    assert( p->nCexes < p->nCexesAlloc );
    for ( i = 0; i < p->pCnf->nVars; i++ )
    {
        if ( pModel[i] == l_True )
        {
            assert( Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0 );
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes );
        }
    }
    p->nCexes++;
}